

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O0

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
unsynchronized_pop<depspawn::internal::TaskPool::Task*>
          (queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this,
          Task **ret)

{
  index_t iVar1;
  tag_t tVar2;
  fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
  *in_RDI;
  tagged_node_handle new_head;
  tagged_node_handle new_tail;
  node *next_ptr;
  tagged_node_handle next;
  tagged_node_handle tail;
  node *head_ptr;
  tagged_node_handle head;
  tagged_node_handle *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  index_t in_stack_ffffffffffffffa2;
  uint in_stack_ffffffffffffffa4;
  tagged_index local_44;
  tagged_index local_40;
  tagged_index local_3c;
  node *local_38;
  tagged_index local_30;
  tagged_index local_2c;
  node *local_28;
  tagged_index local_1c;
  
  while( true ) {
    while( true ) {
      local_1c = std::atomic<boost::lockfree::detail::tagged_index>::load
                           ((atomic<boost::lockfree::detail::tagged_index> *)in_RDI,
                            memory_order_relaxed);
      local_28 = detail::
                 fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                 ::get_pointer((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                                *)CONCAT44(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0)),
                               in_stack_ffffffffffffff98);
      local_2c = std::atomic<boost::lockfree::detail::tagged_index>::load
                           (&in_RDI[2].pool_,memory_order_relaxed);
      local_30 = std::atomic<boost::lockfree::detail::tagged_index>::load
                           (&local_28->next,memory_order_relaxed);
      local_38 = detail::
                 fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                 ::get_pointer((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                                *)CONCAT44(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0)),
                               in_stack_ffffffffffffff98);
      iVar1 = detail::
              fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
              ::get_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                            *)CONCAT44(in_stack_ffffffffffffffa4,
                                       CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)
                                      ),in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa4 = (uint)iVar1;
      iVar1 = detail::
              fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
              ::get_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                            *)(ulong)CONCAT24(iVar1,CONCAT22(in_stack_ffffffffffffffa2,
                                                             in_stack_ffffffffffffffa0)),
                           in_stack_ffffffffffffff98);
      if (in_stack_ffffffffffffffa4 == iVar1) break;
      if (local_38 != (node *)0x0) {
        detail::
        copy_payload<depspawn::internal::TaskPool::Task*,depspawn::internal::TaskPool::Task*>
                  ((Task **)CONCAT44(in_stack_ffffffffffffffa4,
                                     CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                   (Task **)in_stack_ffffffffffffff98);
        iVar1 = detail::
                fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                ::get_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                              *)CONCAT44(in_stack_ffffffffffffffa4,
                                         CONCAT22(in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0)),
                             in_stack_ffffffffffffff98);
        tVar2 = detail::tagged_index::get_next_tag
                          ((tagged_index *)
                           CONCAT44(in_stack_ffffffffffffffa4,
                                    CONCAT22(in_stack_ffffffffffffffa2,iVar1)));
        detail::tagged_index::tagged_index(&local_44,iVar1,tVar2);
        std::atomic<boost::lockfree::detail::tagged_index>::store
                  ((atomic<boost::lockfree::detail::tagged_index> *)in_RDI,local_44,
                   memory_order_seq_cst);
        detail::
        fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
        ::destruct<false>(in_RDI,local_1c);
        return true;
      }
    }
    if (local_38 == (node *)0x0) break;
    in_stack_ffffffffffffffa2 =
         detail::
         fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
         ::get_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                       *)CONCAT44(in_stack_ffffffffffffffa4,
                                  CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                      in_stack_ffffffffffffff98);
    tVar2 = detail::tagged_index::get_next_tag
                      ((tagged_index *)
                       CONCAT44(in_stack_ffffffffffffffa4,
                                CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)));
    detail::tagged_index::tagged_index(&local_3c,in_stack_ffffffffffffffa2,tVar2);
    local_40 = local_3c;
    std::atomic<boost::lockfree::detail::tagged_index>::store
              (&in_RDI[2].pool_,local_3c,memory_order_seq_cst);
  }
  return false;
}

Assistant:

bool unsynchronized_pop (U & ret)
    {
        for (;;) {
            tagged_node_handle head = head_.load(memory_order_relaxed);
            node * head_ptr = pool.get_pointer(head);
            tagged_node_handle tail = tail_.load(memory_order_relaxed);
            tagged_node_handle next = head_ptr->next.load(memory_order_relaxed);
            node * next_ptr = pool.get_pointer(next);

            if (pool.get_handle(head) == pool.get_handle(tail)) {
                if (next_ptr == 0)
                    return false;

                tagged_node_handle new_tail(pool.get_handle(next), tail.get_next_tag());
                tail_.store(new_tail);
            } else {
                if (next_ptr == 0)
                    /* this check is not part of the original algorithm as published by michael and scott
                     *
                     * however we reuse the tagged_ptr part for the freelist and clear the next part during node
                     * allocation. we can observe a null-pointer here.
                     * */
                    continue;
                detail::copy_payload(next_ptr->data, ret);
                tagged_node_handle new_head(pool.get_handle(next), head.get_next_tag());
                head_.store(new_head);
                pool.template destruct<false>(head);
                return true;
            }
        }
    }